

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_consttex.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  long lVar4;
  undefined4 in_register_0000003c;
  double greenCol [3];
  double redCol [3];
  CoefficientSpectrum<60> cs;
  Spectrum green;
  Spectrum red;
  Spectrum res;
  double local_7d8 [4];
  double local_7b8 [4];
  double local_798 [61];
  SampledSpectrum local_5b0;
  SampledSpectrum local_3d0;
  SampledSpectrum local_1f0;
  
  phyr::SampledSpectrum::init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,argc));
  local_7b8[0] = 1.0;
  local_7b8[1] = 0.0;
  lVar4 = 0;
  local_7b8[2] = 0.0;
  phyr::SampledSpectrum::getFromRGB(&local_3d0,local_7b8,Reflectance);
  local_7d8[0] = 0.0;
  local_7d8[1] = 1.0;
  local_7d8[2] = 0.0;
  phyr::SampledSpectrum::getFromRGB(&local_5b0,local_7d8,Reflectance);
  memset(local_798,0,0x1e0);
  do {
    dVar1 = local_3d0.super_CoefficientSpectrum<60>.samples[lVar4 + 1];
    dVar2 = local_5b0.super_CoefficientSpectrum<60>.samples[lVar4 + 1];
    local_798[lVar4] =
         local_5b0.super_CoefficientSpectrum<60>.samples[lVar4] *
         local_3d0.super_CoefficientSpectrum<60>.samples[lVar4];
    local_798[lVar4 + 1] = dVar2 * dVar1;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x3c);
  memcpy(&local_1f0,local_798,0x1e0);
  phyr::SampledSpectrum::toXYZConstants(&local_1f0,local_798);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"R: ",3);
  poVar3 = std::ostream::_M_insert<double>
                     (local_798[2] * -0.49853500723838806 +
                      local_798[0] * 3.240478992462158 + local_798[1] * -1.5371500253677368);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", G: ",5);
  poVar3 = std::ostream::_M_insert<double>
                     (local_798[2] * 0.04155600070953369 +
                      local_798[0] * -0.9692559838294983 + local_798[1] * 1.8759909868240356);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", B: ",5);
  poVar3 = std::ostream::_M_insert<double>
                     (local_798[2] * 1.0573110580444336 +
                      local_798[0] * 0.05564799904823303 + local_798[1] * -0.20404300093650818);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
    using namespace phyr;

    // Initiate Spectrum data
    Spectrum::init();

    // Create a red Spectrum
    Real redCol[3] = { 1, 0, 0 };
    Spectrum red = Spectrum::getFromRGB(redCol, SpectrumType::Reflectance);

    Real greenCol[3] = { 0, 1, 0 };
    Spectrum green = Spectrum::getFromRGB(greenCol, SpectrumType::Reflectance);

    Real resCol[3];
    Spectrum res = red * green;
    res.toRGBConstants(resCol);

    std::cout << "R: " << resCol[0] << ", G: " << resCol[1] << ", B: " << resCol[2] <<  std::endl;
    return 0;
}